

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args;
  SyntaxNode *args_2;
  StandardPropertyCaseItemSyntax *pSVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::ExpressionSyntax>
                   ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StandardPropertyCaseItemSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,(PropertyExprSyntax *)args_2,
                      &local_50);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StandardPropertyCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StandardPropertyCaseItemSyntax>(
        *deepClone(node.expressions, alloc),
        node.colon.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}